

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::energies
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,
          vector<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
          *samples_like)

{
  pointer puVar1;
  iterator __position;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *it;
  pointer sample;
  double local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sample = (samples_like->
           super__Vector_base<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (samples_like->
           super__Vector_base<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (sample != puVar1) {
    do {
      local_30 = energy(this,sample);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      sample = sample + 1;
    } while (sample != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FloatType> energies( const std::vector<Sample<IndexType>> &samples_like ) const {
      std::vector<FloatType> en_vec;
      for ( auto &it : samples_like ) {
        en_vec.push_back( energy( it ) );
      }
      return en_vec;
    }